

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.cpp
# Opt level: O0

size_t duckdb_zstd::FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  size_t in_RCX;
  void *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  uint in_R8D;
  void *in_R9;
  size_t in_stack_00000280;
  undefined8 local_8;
  
  if ((int)workSpace == 0) {
    local_8 = FSE_decompress_wksp_body_default
                        (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D,in_R9,in_stack_00000280);
  }
  else {
    local_8 = FSE_decompress_wksp_body_bmi2
                        (in_RDI,in_RSI,in_RDX,in_RCX,in_R8D,in_R9,in_stack_00000280);
  }
  return local_8;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}